

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1load.c
# Opt level: O0

void parse_subrs(T1_Face face,T1_Loader loader)

{
  int iVar1;
  _func_void_PS_Parser_T1_Token_FT_UInt_FT_Int_ptr *p_Var2;
  FT_Pointer __dest;
  FT_Memory extraout_RDX;
  FT_Memory extraout_RDX_00;
  FT_Memory extraout_RDX_01;
  FT_Memory pFVar3;
  FT_Memory extraout_RDX_02;
  FT_Memory extraout_RDX_03;
  FT_Memory extraout_RDX_04;
  FT_Int FVar4;
  FT_Byte **size_00;
  FT_Byte *temp;
  FT_Byte *base;
  FT_ULong size;
  FT_Long idx;
  PSAux_Service psaux;
  int local_38;
  FT_UInt count;
  FT_Int num_subrs;
  FT_Error error;
  FT_Memory memory;
  PS_Table table;
  T1_Parser parser;
  T1_Loader loader_local;
  T1_Face face_local;
  
  memory = (FT_Memory)&loader->subrs;
  _num_subrs = (loader->parser).root.memory;
  idx = (FT_Long)face->psaux;
  table = (PS_Table)loader;
  parser = &loader->parser;
  loader_local = (T1_Loader)face;
  (*(loader->parser).root.funcs.skip_spaces)((PS_Parser)loader);
  FVar4 = (FT_Int)loader;
  if ((table->block < (FT_Byte *)table->capacity) && (*table->block == '[')) {
    (*(table->funcs).init)(table,FVar4,extraout_RDX);
    (*(code *)table->memory)(table);
    if ((table->block < (FT_Byte *)table->capacity) && (*table->block == ']')) {
      return;
    }
    *(undefined4 *)&table->init = 3;
    return;
  }
  local_38 = (*(table->funcs).done)(table);
  if (local_38 < 0) {
    *(undefined4 *)&table->init = 3;
    return;
  }
  pFVar3 = extraout_RDX_00;
  if (((table->block <= (FT_Byte *)table->capacity) &&
      (pFVar3 = (FT_Memory)table->block,
      (long)(table->capacity - (long)pFVar3) >> 3 < (long)local_38)) &&
     (local_38 = (int)((long)(table->capacity - (long)table->block) >> 3),
     parser[3].root.funcs.to_token_array == (_func_void_PS_Parser_T1_Token_FT_UInt_FT_Int_ptr *)0x0)
     ) {
    p_Var2 = (_func_void_PS_Parser_T1_Token_FT_UInt_FT_Int_ptr *)
             ft_mem_alloc(_num_subrs,0x28,(FT_Error *)&count);
    parser[3].root.funcs.to_token_array = p_Var2;
    if (count != 0) goto LAB_001bbd92;
    pFVar3 = _num_subrs;
    count = ft_hash_num_init((FT_Hash)parser[3].root.funcs.to_token_array,_num_subrs);
    FVar4 = (FT_Int)pFVar3;
    pFVar3 = extraout_RDX_01;
    if (count != 0) goto LAB_001bbd92;
  }
  (*(table->funcs).init)(table,FVar4,pFVar3);
  if ((int)table->init != 0) {
    return;
  }
  (*(code *)table->memory)(table);
  if ((*(int *)&parser[3].root.limit != 0) ||
     (count = (*(code *)**(undefined8 **)idx)(memory,local_38,_num_subrs), count == 0)) {
    psaux._4_4_ = 0;
    while (table->block + 4 < (FT_Byte *)table->capacity) {
      FVar4 = 0x1ee28e;
      iVar1 = strncmp((char *)table->block,"dup",3);
      if (iVar1 != 0) break;
      (*(table->funcs).init)(table,FVar4,extraout_RDX_02);
      size = (*(table->funcs).done)(table);
      size_00 = &base;
      iVar1 = read_binary_data((T1_Parser)table,(FT_ULong *)size_00,&temp,
                               (loader_local->encoding_table).elements[0xd] != (FT_Byte *)0x0);
      if (iVar1 == 0) {
        return;
      }
      (*(table->funcs).init)(table,(FT_Int)size_00,extraout_RDX_03);
      if ((int)table->init != 0) {
        return;
      }
      (*(code *)table->memory)(table);
      if (table->block + 4 < (FT_Byte *)table->capacity) {
        FVar4 = 0x1d804b;
        iVar1 = strncmp((char *)table->block,"put",3);
        if (iVar1 == 0) {
          (*(table->funcs).init)(table,FVar4,extraout_RDX_04);
          (*(code *)table->memory)(table);
        }
      }
      if (parser[3].root.funcs.to_token_array !=
          (_func_void_PS_Parser_T1_Token_FT_UInt_FT_Int_ptr *)0x0) {
        ft_hash_num_insert((FT_Int)size,(ulong)psaux._4_4_,
                           (FT_Hash)parser[3].root.funcs.to_token_array,_num_subrs);
        size = (FT_ULong)psaux._4_4_;
      }
      if (*(int *)&parser[3].root.limit == 0) {
        if (*(int *)((long)&(loader_local->glyph_names).cursor + 4) < 0) {
          count = (*memory[2].free)(memory,(void *)(size & 0xffffffff));
        }
        else {
          if (base < (FT_Byte *)(long)*(int *)((long)&(loader_local->glyph_names).cursor + 4)) {
            count = 3;
            goto LAB_001bbd92;
          }
          __dest = ft_mem_alloc(_num_subrs,(FT_Long)base,(FT_Error *)&count);
          if (count != 0) goto LAB_001bbd92;
          memcpy(__dest,temp,(size_t)base);
          (**(code **)(idx + 0x20))(__dest,base,0x10ea);
          base = base + -(long)*(int *)((long)&(loader_local->glyph_names).cursor + 4);
          count = (*memory[2].free)(memory,(void *)(size & 0xffffffff));
          ft_mem_free(_num_subrs,__dest);
        }
        if (count != 0) goto LAB_001bbd92;
      }
      psaux._4_4_ = psaux._4_4_ + 1;
    }
    if (*(int *)&parser[3].root.limit != 0) {
      return;
    }
    *(int *)&parser[3].root.limit = local_38;
    return;
  }
LAB_001bbd92:
  *(FT_UInt *)&table->init = count;
  return;
}

Assistant:

static void
  parse_subrs( T1_Face    face,
               T1_Loader  loader )
  {
    T1_Parser  parser = &loader->parser;
    PS_Table   table  = &loader->subrs;
    FT_Memory  memory = parser->root.memory;
    FT_Error   error;
    FT_Int     num_subrs;
    FT_UInt    count;

    PSAux_Service  psaux = (PSAux_Service)face->psaux;


    T1_Skip_Spaces( parser );

    /* test for empty array */
    if ( parser->root.cursor < parser->root.limit &&
         *parser->root.cursor == '['              )
    {
      T1_Skip_PS_Token( parser );
      T1_Skip_Spaces  ( parser );
      if ( parser->root.cursor >= parser->root.limit ||
           *parser->root.cursor != ']'               )
        parser->root.error = FT_THROW( Invalid_File_Format );
      return;
    }

    num_subrs = (FT_Int)T1_ToInt( parser );
    if ( num_subrs < 0 )
    {
      parser->root.error = FT_THROW( Invalid_File_Format );
      return;
    }

    /* we certainly need more than 8 bytes per subroutine */
    if ( parser->root.limit >= parser->root.cursor                     &&
         num_subrs > ( parser->root.limit - parser->root.cursor ) >> 3 )
    {
      /*
       * There are two possibilities.  Either the font contains an invalid
       * value for `num_subrs', or we have a subsetted font where the
       * subroutine indices are not adjusted, e.g.
       *
       *   /Subrs 812 array
       *     dup 0 { ... } NP
       *     dup 51 { ... } NP
       *     dup 681 { ... } NP
       *   ND
       *
       * In both cases, we use a number hash that maps from subr indices to
       * actual array elements.
       */

      FT_TRACE0(( "parse_subrs: adjusting number of subroutines"
                  " (from %d to %d)\n",
                  num_subrs,
                  ( parser->root.limit - parser->root.cursor ) >> 3 ));
      num_subrs = ( parser->root.limit - parser->root.cursor ) >> 3;

      if ( !loader->subrs_hash )
      {
        if ( FT_NEW( loader->subrs_hash ) )
          goto Fail;

        error = ft_hash_num_init( loader->subrs_hash, memory );
        if ( error )
          goto Fail;
      }
    }

    /* position the parser right before the `dup' of the first subr */
    T1_Skip_PS_Token( parser );         /* `array' */
    if ( parser->root.error )
      return;
    T1_Skip_Spaces( parser );

    /* initialize subrs array -- with synthetic fonts it is possible */
    /* we get here twice                                             */
    if ( !loader->num_subrs )
    {
      error = psaux->ps_table_funcs->init( table, num_subrs, memory );
      if ( error )
        goto Fail;
    }

    /* the format is simple:   */
    /*                         */
    /*   `index' + binary data */
    /*                         */
    for ( count = 0; ; count++ )
    {
      FT_Long   idx;
      FT_ULong  size;
      FT_Byte*  base;


      /* If we are out of data, or if the next token isn't `dup', */
      /* we are done.                                             */
      if ( parser->root.cursor + 4 >= parser->root.limit          ||
          ft_strncmp( (char*)parser->root.cursor, "dup", 3 ) != 0 )
        break;

      T1_Skip_PS_Token( parser );       /* `dup' */

      idx = T1_ToInt( parser );

      if ( !read_binary_data( parser, &size, &base, IS_INCREMENTAL ) )
        return;

      /* The binary string is followed by one token, e.g. `NP' */
      /* (bound to `noaccess put') or by two separate tokens:  */
      /* `noaccess' & `put'.  We position the parser right     */
      /* before the next `dup', if any.                        */
      T1_Skip_PS_Token( parser );   /* `NP' or `|' or `noaccess' */
      if ( parser->root.error )
        return;
      T1_Skip_Spaces  ( parser );

      if ( parser->root.cursor + 4 < parser->root.limit            &&
           ft_strncmp( (char*)parser->root.cursor, "put", 3 ) == 0 )
      {
        T1_Skip_PS_Token( parser ); /* skip `put' */
        T1_Skip_Spaces  ( parser );
      }

      /* if we use a hash, the subrs index is the key, and a running */
      /* counter specified for `T1_Add_Table' acts as the value      */
      if ( loader->subrs_hash )
      {
        ft_hash_num_insert( idx, count, loader->subrs_hash, memory );
        idx = count;
      }

      /* with synthetic fonts it is possible we get here twice */
      if ( loader->num_subrs )
        continue;

      /* some fonts use a value of -1 for lenIV to indicate that */
      /* the charstrings are unencoded                           */
      /*                                                         */
      /* thanks to Tom Kacvinsky for pointing this out           */
      /*                                                         */
      if ( face->type1.private_dict.lenIV >= 0 )
      {
        FT_Byte*  temp = NULL;


        /* some fonts define empty subr records -- this is not totally */
        /* compliant to the specification (which says they should at   */
        /* least contain a `return'), but we support them anyway       */
        if ( size < (FT_ULong)face->type1.private_dict.lenIV )
        {
          error = FT_THROW( Invalid_File_Format );
          goto Fail;
        }

        /* t1_decrypt() shouldn't write to base -- make temporary copy */
        if ( FT_ALLOC( temp, size ) )
          goto Fail;
        FT_MEM_COPY( temp, base, size );
        psaux->t1_decrypt( temp, size, 4330 );
        size -= (FT_ULong)face->type1.private_dict.lenIV;
        error = T1_Add_Table( table, (FT_Int)idx,
                              temp + face->type1.private_dict.lenIV, size );
        FT_FREE( temp );
      }
      else
        error = T1_Add_Table( table, (FT_Int)idx, base, size );
      if ( error )
        goto Fail;
    }

    if ( !loader->num_subrs )
      loader->num_subrs = num_subrs;

    return;

  Fail:
    parser->root.error = error;
  }